

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_digest.c
# Opt level: O2

void test_archive_rmd160(void)

{
  int iVar1;
  uchar buf [1];
  archive_rmd160_ctx ctx;
  uchar actualmd [21];
  uchar md [20];
  
  buf[0] = '\0';
  actualmd[0] = 200;
  actualmd[1] = '\x1b';
  actualmd[2] = 0x94;
  actualmd[3] = 0x93;
  actualmd[4] = '4';
  actualmd[5] = ' ';
  actualmd[6] = '\"';
  actualmd[7] = '\x1a';
  actualmd[8] = 'z';
  actualmd[9] = 0xc0;
  actualmd[10] = '\x04';
  actualmd[0xb] = 0xa9;
  actualmd[0xc] = '\x02';
  actualmd[0xd] = 'B';
  actualmd[0xe] = 0xd8;
  actualmd[0xf] = 0xb1;
  actualmd[0x10] = 0xd3;
  actualmd[0x11] = 0xe5;
  actualmd[0x12] = '\a';
  actualmd[0x13] = '\r';
  actualmd[0x14] = '\0';
  iVar1 = __archive_ripemd160init(&ctx);
  if (iVar1 == 0) {
    iVar1 = __archive_ripemd160update(&ctx,buf,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_rmd160_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_ripemd160final(&ctx,md);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_rmd160_final(&ctx, md)",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'@',md,"md",actualmd,"actualmd",0x14,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                   ,L';');
    test_skipping("This platform does not support RMD160");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_rmd160)
{
	archive_rmd160_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[20];
	unsigned char actualmd[] = "\xc8\x1b\x94\x93\x34\x20\x22\x1a\x7a\xc0"
                             "\x04\xa9\x02\x42\xd8\xb1\xd3\xe5\x07\x0d";

	if (ARCHIVE_OK != archive_rmd160_init(&ctx)) {
		skipping("This platform does not support RMD160");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_rmd160_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_rmd160_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}